

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O1

StatusOr<int> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetInt32(UnparseProto3Type *this,Field f)

{
  long lVar1;
  char cVar2;
  undefined8 *puVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  StatusOr<int> SVar4;
  int32_t val;
  Status local_98;
  undefined1 local_90 [40];
  char *local_68;
  undefined8 local_40;
  undefined8 local_38;
  
  puVar3 = (undefined8 *)
           ((ulong)(f->raw_->field_0)._impl_.default_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar1 = puVar3[1];
  if (lVar1 == 0) {
    *(undefined4 *)(this + 8) = 0;
  }
  else {
    cVar2 = absl::lts_20240722::numbers_internal::safe_strto32_base
                      (lVar1,*puVar3,local_90 + 0x20,10);
    if (cVar2 == '\0') {
      local_90[0x20] = '!';
      local_90[0x21] = '\0';
      local_90[0x22] = '\0';
      local_90[0x23] = '\0';
      local_90[0x24] = '\0';
      local_90[0x25] = '\0';
      local_90[0x26] = '\0';
      local_90[0x27] = '\0';
      local_68 = "bad default value in type.proto: ";
      puVar3 = (undefined8 *)
               ((ulong)(f->parent_->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
               );
      local_38 = *puVar3;
      local_40 = puVar3[1];
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,(AlphaNum *)(local_90 + 0x20));
      absl::lts_20240722::InternalError(&local_98,local_90._8_8_,local_90._0_8_);
      absl::lts_20240722::internal_statusor::StatusOrData<int>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)this,&local_98);
      in_RDX = extraout_RDX_00;
      if ((local_98.rep_ & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
        in_RDX = extraout_RDX_01;
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        in_RDX = extraout_RDX_02;
      }
      goto LAB_002dc07e;
    }
    *(undefined4 *)(this + 8) = local_90._32_4_;
    in_RDX = extraout_RDX;
  }
  *(undefined8 *)this = 1;
LAB_002dc07e:
  SVar4.super_StatusOrData<int>._8_8_ = in_RDX;
  SVar4.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)this;
  return (StatusOr<int>)SVar4.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> GetInt32(Field f) {
    if (f->proto().default_value().empty()) {
      return 0;
    }
    int32_t x;
    if (!absl::SimpleAtoi(f->proto().default_value(), &x)) {
      return absl::InternalError(absl::StrCat(
          "bad default value in type.proto: ", f->parent().proto().name()));
    }
    return x;
  }